

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_257,_true,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong unaff_R15;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined4 uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  float fVar50;
  float fVar51;
  undefined1 auVar49 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  vfloat4 a0;
  undefined1 auVar57 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_2578 [4];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [8];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float fStack_2520;
  undefined4 uStack_251c;
  undefined1 local_2518 [32];
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [32];
  undefined1 local_2498 [32];
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  undefined1 auVar22 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar21 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar9 = ZEXT812(0) << 0x20;
    auVar24 = ZEXT816(0) << 0x40;
    auVar22._4_12_ = auVar9;
    auVar22._0_4_ = auVar21._0_4_;
    auVar19 = vrsqrt14ss_avx512f(auVar24,auVar22);
    fVar48 = auVar19._0_4_;
    local_2578[0] = fVar48 * 1.5 - auVar21._0_4_ * 0.5 * fVar48 * fVar48 * fVar48;
    local_24f8 = aVar2.x;
    auVar57._0_4_ = local_24f8 * local_2578[0];
    auVar57._4_4_ = aVar2.y * local_2578[0];
    auVar57._8_4_ = aVar2.z * local_2578[0];
    auVar57._12_4_ = aVar2.field_3.w * local_2578[0];
    auVar19 = vshufpd_avx(auVar57,auVar57,1);
    auVar21 = vmovshdup_avx(auVar57);
    auVar75._8_4_ = 0x80000000;
    auVar75._0_8_ = 0x8000000080000000;
    auVar75._12_4_ = 0x80000000;
    auVar73._0_4_ = auVar21._0_4_ ^ 0x80000000;
    auVar21 = vunpckhps_avx(auVar57,auVar24);
    auVar73._4_12_ = auVar9;
    auVar22 = vshufps_avx(auVar21,auVar73,0x41);
    auVar71._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
    auVar71._8_8_ = auVar75._8_8_ ^ auVar19._8_8_;
    auVar20 = vinsertps_avx(auVar71,auVar57,0x2a);
    auVar21 = vdpps_avx(auVar22,auVar22,0x7f);
    auVar19 = vdpps_avx(auVar20,auVar20,0x7f);
    uVar4 = vcmpps_avx512vl(auVar19,auVar21,1);
    auVar21 = vpmovm2d_avx512vl(uVar4);
    auVar76._0_4_ = auVar21._0_4_;
    auVar76._4_4_ = auVar76._0_4_;
    auVar76._8_4_ = auVar76._0_4_;
    auVar76._12_4_ = auVar76._0_4_;
    uVar17 = vpmovd2m_avx512vl(auVar76);
    auVar21 = vpcmpeqd_avx(auVar76,auVar76);
    auVar19._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar21._4_4_;
    auVar19._0_4_ = (uint)((byte)uVar17 & 1) * auVar21._0_4_;
    auVar19._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar21._8_4_;
    auVar19._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar21._12_4_;
    auVar21 = vblendvps_avx(auVar20,auVar22,auVar19);
    auVar19 = vdpps_avx(auVar21,auVar21,0x7f);
    auVar77._4_12_ = auVar9;
    auVar77._0_4_ = auVar19._0_4_;
    auVar20 = vrsqrt14ss_avx512f(auVar24,auVar77);
    fVar48 = auVar20._0_4_;
    fVar48 = fVar48 * 1.5 - auVar19._0_4_ * 0.5 * fVar48 * fVar48 * fVar48;
    auVar72._0_4_ = fVar48 * auVar21._0_4_;
    auVar72._4_4_ = fVar48 * auVar21._4_4_;
    auVar72._8_4_ = fVar48 * auVar21._8_4_;
    auVar72._12_4_ = fVar48 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar72,auVar72,0xc9);
    auVar19 = vshufps_avx(auVar57,auVar57,0xc9);
    auVar78._0_4_ = auVar19._0_4_ * auVar72._0_4_;
    auVar78._4_4_ = auVar19._4_4_ * auVar72._4_4_;
    auVar78._8_4_ = auVar19._8_4_ * auVar72._8_4_;
    auVar78._12_4_ = auVar19._12_4_ * auVar72._12_4_;
    auVar21 = vfmsub231ps_fma(auVar78,auVar57,auVar21);
    auVar19 = vshufps_avx(auVar21,auVar21,0xc9);
    auVar21 = vdpps_avx(auVar19,auVar19,0x7f);
    auVar20._4_12_ = auVar9;
    auVar20._0_4_ = auVar21._0_4_;
    auVar20 = vrsqrt14ss_avx512f(auVar24,auVar20);
    fVar48 = auVar20._0_4_;
    fVar48 = fVar48 * 1.5 - auVar21._0_4_ * 0.5 * fVar48 * fVar48 * fVar48;
    auVar25._0_4_ = auVar19._0_4_ * fVar48;
    auVar25._4_4_ = auVar19._4_4_ * fVar48;
    auVar25._8_4_ = auVar19._8_4_ * fVar48;
    auVar25._12_4_ = auVar19._12_4_ * fVar48;
    auVar21._0_4_ = local_2578[0] * auVar57._0_4_;
    auVar21._4_4_ = local_2578[0] * auVar57._4_4_;
    auVar21._8_4_ = local_2578[0] * auVar57._8_4_;
    auVar21._12_4_ = local_2578[0] * auVar57._12_4_;
    auVar20 = vunpcklps_avx(auVar72,auVar21);
    auVar21 = vunpckhps_avx(auVar72,auVar21);
    auVar22 = vunpcklps_avx(auVar25,auVar24);
    auVar19 = vunpckhps_avx(auVar25,auVar24);
    local_2548 = vunpcklps_avx(auVar21,auVar19);
    local_2568 = vunpcklps_avx(auVar20,auVar22);
    local_2558 = vunpckhps_avx(auVar20,auVar22);
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370 = 0;
    if (local_2378 != 8) {
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar20 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx512vl((undefined1  [16])aVar2,auVar24);
      puVar15 = local_2368;
      auVar6._8_4_ = 0x219392ef;
      auVar6._0_8_ = 0x219392ef219392ef;
      auVar6._12_4_ = 0x219392ef;
      uVar17 = vcmpps_avx512vl(auVar21,auVar6,1);
      auVar49._8_4_ = 0x3f800000;
      auVar49._0_8_ = &DAT_3f8000003f800000;
      auVar49._12_4_ = 0x3f800000;
      auVar21 = vdivps_avx(auVar49,(undefined1  [16])aVar2);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar3 = (bool)((byte)uVar17 & 1);
      auVar23._0_4_ = (uint)bVar3 * auVar22._0_4_ | (uint)!bVar3 * auVar21._0_4_;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar3 * auVar22._4_4_ | (uint)!bVar3 * auVar21._4_4_;
      bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar3 * auVar22._8_4_ | (uint)!bVar3 * auVar21._8_4_;
      bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar3 * auVar22._12_4_ | (uint)!bVar3 * auVar21._12_4_;
      auVar7._8_4_ = 0x3f7ffffa;
      auVar7._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar7._12_4_ = 0x3f7ffffa;
      auVar24 = vmulps_avx512vl(auVar23,auVar7);
      auVar8._8_4_ = 0x3f800003;
      auVar8._0_8_ = 0x3f8000033f800003;
      auVar8._12_4_ = 0x3f800003;
      auVar25 = vmulps_avx512vl(auVar23,auVar8);
      local_23b8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar82 = ZEXT3264(local_23b8);
      local_23d8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar83 = ZEXT3264(local_23d8);
      local_23f8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar84 = ZEXT3264(local_23f8);
      auVar29._8_4_ = 1;
      auVar29._0_8_ = 0x100000001;
      auVar29._12_4_ = 1;
      auVar29._16_4_ = 1;
      auVar29._20_4_ = 1;
      auVar29._24_4_ = 1;
      auVar29._28_4_ = 1;
      auVar74 = ZEXT3264(auVar29);
      local_2518 = vpermps_avx2(auVar29,ZEXT1632((undefined1  [16])aVar2));
      auVar26._8_4_ = 2;
      auVar26._0_8_ = 0x200000002;
      auVar26._12_4_ = 2;
      auVar26._16_4_ = 2;
      auVar26._20_4_ = 2;
      auVar26._24_4_ = 2;
      auVar26._28_4_ = 2;
      _local_2538 = vpermps_avx2(auVar26,ZEXT1632((undefined1  [16])aVar2));
      local_2418 = vbroadcastss_avx512vl(auVar24);
      auVar85 = ZEXT3264(local_2418);
      auVar21 = vmovshdup_avx(auVar24);
      local_2438 = vbroadcastsd_avx512vl(auVar21);
      auVar86 = ZEXT3264(local_2438);
      auVar22 = vshufpd_avx(auVar24,auVar24,1);
      local_2458 = vpermps_avx512vl(auVar26,ZEXT1632(auVar24));
      auVar87 = ZEXT3264(local_2458);
      local_2478 = vbroadcastss_avx512vl(auVar25);
      auVar88 = ZEXT3264(local_2478);
      local_2498 = vpermps_avx512vl(auVar29,ZEXT1632(auVar25));
      auVar89 = ZEXT3264(local_2498);
      local_24b8 = vpermps_avx512vl(auVar26,ZEXT1632(auVar25));
      auVar90 = ZEXT3264(local_24b8);
      uVar14 = (ulong)(auVar24._0_4_ < 0.0) * 0x20;
      uVar17 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x80;
      local_24d8 = vbroadcastss_avx512vl(auVar19);
      auVar91 = ZEXT3264(local_24d8);
      uVar45 = auVar20._0_4_;
      auVar40 = ZEXT3264(CONCAT428(uVar45,CONCAT424(uVar45,CONCAT420(uVar45,CONCAT416(uVar45,
                                                  CONCAT412(uVar45,CONCAT48(uVar45,CONCAT44(uVar45,
                                                  uVar45))))))));
      auVar26 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar92 = ZEXT3264(auVar26);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar93 = ZEXT3264(auVar26);
      fStack_24f4 = local_24f8;
      fStack_24f0 = local_24f8;
      fStack_24ec = local_24f8;
      fStack_24e8 = local_24f8;
      fStack_24e4 = local_24f8;
      fStack_24e0 = local_24f8;
      fStack_24dc = local_24f8;
      do {
        fVar48 = (ray->super_RayK<1>).tfar;
        auVar42 = ZEXT464((uint)fVar48);
        do {
          if (puVar15 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(puVar15 + -1);
          auVar44 = ZEXT464((uint)*pfVar1);
          puVar15 = puVar15 + -2;
        } while (fVar48 < *pfVar1);
        uVar18 = *puVar15;
        do {
          auVar26 = auVar82._0_32_;
          auVar29 = auVar83._0_32_;
          auVar31 = auVar84._0_32_;
          if ((uVar18 & 0xf) == 0) {
            auVar27 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar14),auVar26);
            auVar27 = vmulps_avx512vl(auVar85._0_32_,auVar27);
            auVar28 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar17),auVar29);
            auVar28 = vmulps_avx512vl(auVar86._0_32_,auVar28);
            auVar27 = vmaxps_avx(auVar27,auVar28);
            auVar28 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar16),auVar31);
            auVar28 = vmulps_avx512vl(auVar87._0_32_,auVar28);
            auVar26 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar14 ^ 0x20)),
                                      auVar26);
            auVar26 = vmulps_avx512vl(auVar88._0_32_,auVar26);
            auVar29 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar17 ^ 0x20)),
                                      auVar29);
            auVar29 = vmulps_avx512vl(auVar89._0_32_,auVar29);
            auVar29 = vminps_avx(auVar26,auVar29);
            auVar26 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar16 ^ 0x20)),
                                      auVar31);
            auVar30 = vmulps_avx512vl(auVar90._0_32_,auVar26);
            auVar31 = vmaxps_avx512vl(auVar28,auVar91._0_32_);
            auVar26 = vmaxps_avx(auVar27,auVar31);
            auVar27 = vminps_avx(auVar30,auVar40._0_32_);
            auVar29 = vminps_avx(auVar29,auVar27);
LAB_01fb8289:
            auVar44 = ZEXT3264(auVar31);
            auVar74 = ZEXT3264(auVar26);
            auVar42 = ZEXT3264(auVar29);
            uVar4 = vcmpps_avx512vl(auVar26,auVar29,2);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)(byte)uVar4);
            bVar3 = true;
          }
          else {
            if ((int)(uVar18 & 0xf) == 2) {
              uVar11 = uVar18 & 0xfffffffffffffff0;
              auVar27 = *(undefined1 (*) [32])(uVar11 + 0x100);
              auVar74._0_4_ = (float)local_2538._0_4_ * auVar27._0_4_;
              auVar74._4_4_ = (float)local_2538._4_4_ * auVar27._4_4_;
              auVar74._8_4_ = fStack_2530 * auVar27._8_4_;
              auVar74._12_4_ = fStack_252c * auVar27._12_4_;
              auVar74._16_4_ = fStack_2528 * auVar27._16_4_;
              auVar74._20_4_ = fStack_2524 * auVar27._20_4_;
              auVar74._28_36_ = auVar42._28_36_;
              auVar74._24_4_ = fStack_2520 * auVar27._24_4_;
              auVar28 = *(undefined1 (*) [32])(uVar11 + 0x120);
              auVar42._0_4_ = (float)local_2538._0_4_ * auVar28._0_4_;
              auVar42._4_4_ = (float)local_2538._4_4_ * auVar28._4_4_;
              auVar42._8_4_ = fStack_2530 * auVar28._8_4_;
              auVar42._12_4_ = fStack_252c * auVar28._12_4_;
              auVar42._16_4_ = fStack_2528 * auVar28._16_4_;
              auVar42._20_4_ = fStack_2524 * auVar28._20_4_;
              auVar42._28_36_ = auVar44._28_36_;
              auVar42._24_4_ = fStack_2520 * auVar28._24_4_;
              auVar30 = *(undefined1 (*) [32])(uVar11 + 0x140);
              auVar36._4_4_ = (float)local_2538._4_4_ * auVar30._4_4_;
              auVar36._0_4_ = (float)local_2538._0_4_ * auVar30._0_4_;
              auVar36._8_4_ = fStack_2530 * auVar30._8_4_;
              auVar36._12_4_ = fStack_252c * auVar30._12_4_;
              auVar36._16_4_ = fStack_2528 * auVar30._16_4_;
              auVar36._20_4_ = fStack_2524 * auVar30._20_4_;
              auVar36._24_4_ = fStack_2520 * auVar30._24_4_;
              auVar36._28_4_ = uStack_251c;
              auVar21 = vfmadd231ps_fma(auVar74._0_32_,local_2518,
                                        *(undefined1 (*) [32])(uVar11 + 0xa0));
              auVar19 = vfmadd231ps_fma(auVar42._0_32_,local_2518,
                                        *(undefined1 (*) [32])(uVar11 + 0xc0));
              auVar20 = vfmadd231ps_fma(auVar36,local_2518,*(undefined1 (*) [32])(uVar11 + 0xe0));
              auVar37._4_4_ = fStack_24f4;
              auVar37._0_4_ = local_24f8;
              auVar37._8_4_ = fStack_24f0;
              auVar37._12_4_ = fStack_24ec;
              auVar37._16_4_ = fStack_24e8;
              auVar37._20_4_ = fStack_24e4;
              auVar37._24_4_ = fStack_24e0;
              auVar37._28_4_ = fStack_24dc;
              auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar37,
                                        *(undefined1 (*) [32])(uVar11 + 0x40));
              auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar37,
                                        *(undefined1 (*) [32])(uVar11 + 0x60));
              auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar37,
                                        *(undefined1 (*) [32])(uVar11 + 0x80));
              auVar79._8_4_ = 0x7fffffff;
              auVar79._0_8_ = 0x7fffffff7fffffff;
              auVar79._12_4_ = 0x7fffffff;
              auVar79._16_4_ = 0x7fffffff;
              auVar79._20_4_ = 0x7fffffff;
              auVar79._24_4_ = 0x7fffffff;
              auVar79._28_4_ = 0x7fffffff;
              auVar36 = vandps_avx(auVar79,ZEXT1632(auVar21));
              auVar81._8_4_ = 0x219392ef;
              auVar81._0_8_ = 0x219392ef219392ef;
              auVar81._12_4_ = 0x219392ef;
              auVar81._16_4_ = 0x219392ef;
              auVar81._20_4_ = 0x219392ef;
              auVar81._24_4_ = 0x219392ef;
              auVar81._28_4_ = 0x219392ef;
              uVar13 = vcmpps_avx512vl(auVar36,auVar81,1);
              bVar3 = (bool)((byte)uVar13 & 1);
              auVar33._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar21._0_4_;
              bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar33._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar21._4_4_;
              bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar33._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar21._8_4_;
              bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar33._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar21._12_4_;
              auVar33._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * 0x219392ef;
              auVar33._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * 0x219392ef;
              auVar33._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * 0x219392ef;
              auVar33._28_4_ = (uint)(byte)(uVar13 >> 7) * 0x219392ef;
              auVar36 = vandps_avx(auVar79,ZEXT1632(auVar19));
              uVar13 = vcmpps_avx512vl(auVar36,auVar81,1);
              bVar3 = (bool)((byte)uVar13 & 1);
              auVar34._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._0_4_;
              bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar34._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._4_4_;
              bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar34._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._8_4_;
              bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar34._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._12_4_;
              auVar34._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * 0x219392ef;
              auVar34._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * 0x219392ef;
              auVar34._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * 0x219392ef;
              auVar34._28_4_ = (uint)(byte)(uVar13 >> 7) * 0x219392ef;
              auVar36 = vandps_avx(auVar79,ZEXT1632(auVar20));
              uVar13 = vcmpps_avx512vl(auVar36,auVar81,1);
              bVar3 = (bool)((byte)uVar13 & 1);
              auVar35._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar20._0_4_;
              bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar35._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar20._4_4_;
              bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar35._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar20._8_4_;
              bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar35._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar20._12_4_;
              auVar35._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * 0x219392ef;
              auVar35._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * 0x219392ef;
              auVar35._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * 0x219392ef;
              auVar35._28_4_ = (uint)(byte)(uVar13 >> 7) * 0x219392ef;
              auVar36 = vrcp14ps_avx512vl(auVar33);
              auVar80._8_4_ = 0x3f800000;
              auVar80._0_8_ = &DAT_3f8000003f800000;
              auVar80._12_4_ = 0x3f800000;
              auVar80._16_4_ = 0x3f800000;
              auVar80._20_4_ = 0x3f800000;
              auVar80._24_4_ = 0x3f800000;
              auVar80._28_4_ = 0x3f800000;
              auVar21 = vfnmadd213ps_fma(auVar33,auVar36,auVar80);
              auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar36,auVar36);
              auVar36 = vrcp14ps_avx512vl(auVar34);
              auVar19 = vfnmadd213ps_fma(auVar34,auVar36,auVar80);
              auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar36,auVar36);
              auVar36 = vrcp14ps_avx512vl(auVar35);
              auVar20 = vfnmadd213ps_fma(auVar35,auVar36,auVar80);
              auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar36,auVar36);
              auVar27 = vfmadd213ps_avx512vl(auVar27,auVar31,*(undefined1 (*) [32])(uVar11 + 0x160))
              ;
              auVar28 = vfmadd213ps_avx512vl(auVar28,auVar31,*(undefined1 (*) [32])(uVar11 + 0x180))
              ;
              auVar31 = vfmadd213ps_avx512vl(auVar30,auVar31,*(undefined1 (*) [32])(uVar11 + 0x1a0))
              ;
              auVar27 = vfmadd231ps_avx512vl(auVar27,auVar29,*(undefined1 (*) [32])(uVar11 + 0xa0));
              auVar28 = vfmadd231ps_avx512vl(auVar28,auVar29,*(undefined1 (*) [32])(uVar11 + 0xc0));
              auVar29 = vfmadd231ps_avx512vl(auVar31,auVar29,*(undefined1 (*) [32])(uVar11 + 0xe0));
              auVar27 = vfmadd231ps_avx512vl(auVar27,auVar26,*(undefined1 (*) [32])(uVar11 + 0x40));
              fVar64 = -auVar21._0_4_ * auVar27._0_4_;
              fVar65 = -auVar21._4_4_ * auVar27._4_4_;
              auVar31._4_4_ = fVar65;
              auVar31._0_4_ = fVar64;
              fVar66 = -auVar21._8_4_ * auVar27._8_4_;
              auVar31._8_4_ = fVar66;
              fVar67 = -auVar21._12_4_ * auVar27._12_4_;
              auVar31._12_4_ = fVar67;
              fVar68 = auVar27._16_4_ * -0.0;
              auVar31._16_4_ = fVar68;
              fVar69 = auVar27._20_4_ * -0.0;
              auVar31._20_4_ = fVar69;
              fVar70 = auVar27._24_4_ * -0.0;
              auVar31._24_4_ = fVar70;
              auVar31._28_4_ = auVar27._28_4_;
              auVar28 = vfmadd231ps_avx512vl(auVar28,auVar26,*(undefined1 (*) [32])(uVar11 + 0x60));
              fVar56 = -auVar19._0_4_ * auVar28._0_4_;
              fVar58 = -auVar19._4_4_ * auVar28._4_4_;
              auVar30._4_4_ = fVar58;
              auVar30._0_4_ = fVar56;
              fVar59 = -auVar19._8_4_ * auVar28._8_4_;
              auVar30._8_4_ = fVar59;
              fVar60 = -auVar19._12_4_ * auVar28._12_4_;
              auVar30._12_4_ = fVar60;
              fVar61 = auVar28._16_4_ * -0.0;
              auVar30._16_4_ = fVar61;
              fVar62 = auVar28._20_4_ * -0.0;
              auVar30._20_4_ = fVar62;
              fVar63 = auVar28._24_4_ * -0.0;
              auVar30._24_4_ = fVar63;
              auVar30._28_4_ = auVar28._28_4_;
              auVar26 = vfmadd231ps_avx512vl(auVar29,auVar26,*(undefined1 (*) [32])(uVar11 + 0x80));
              fVar48 = -auVar20._0_4_ * auVar26._0_4_;
              fVar50 = -auVar20._4_4_ * auVar26._4_4_;
              auVar38._4_4_ = fVar50;
              auVar38._0_4_ = fVar48;
              fVar51 = -auVar20._8_4_ * auVar26._8_4_;
              auVar38._8_4_ = fVar51;
              fVar52 = -auVar20._12_4_ * auVar26._12_4_;
              auVar38._12_4_ = fVar52;
              fVar53 = auVar26._16_4_ * -0.0;
              auVar38._16_4_ = fVar53;
              fVar54 = auVar26._20_4_ * -0.0;
              auVar38._20_4_ = fVar54;
              fVar55 = auVar26._24_4_ * -0.0;
              auVar38._24_4_ = fVar55;
              auVar38._28_4_ = auVar26._28_4_;
              auVar41._0_4_ = auVar21._0_4_ + fVar64;
              auVar41._4_4_ = auVar21._4_4_ + fVar65;
              auVar41._8_4_ = auVar21._8_4_ + fVar66;
              auVar41._12_4_ = auVar21._12_4_ + fVar67;
              auVar41._16_4_ = fVar68 + 0.0;
              auVar41._20_4_ = fVar69 + 0.0;
              auVar41._24_4_ = fVar70 + 0.0;
              auVar41._28_4_ = auVar27._28_4_ + 0.0;
              auVar43._0_4_ = auVar19._0_4_ + fVar56;
              auVar43._4_4_ = auVar19._4_4_ + fVar58;
              auVar43._8_4_ = auVar19._8_4_ + fVar59;
              auVar43._12_4_ = auVar19._12_4_ + fVar60;
              auVar43._16_4_ = fVar61 + 0.0;
              auVar43._20_4_ = fVar62 + 0.0;
              auVar43._24_4_ = fVar63 + 0.0;
              auVar43._28_4_ = auVar28._28_4_ + 0.0;
              auVar46._0_4_ = auVar20._0_4_ + fVar48;
              auVar46._4_4_ = auVar20._4_4_ + fVar50;
              auVar46._8_4_ = auVar20._8_4_ + fVar51;
              auVar46._12_4_ = auVar20._12_4_ + fVar52;
              auVar46._16_4_ = fVar53 + 0.0;
              auVar46._20_4_ = fVar54 + 0.0;
              auVar46._24_4_ = fVar55 + 0.0;
              auVar46._28_4_ = auVar26._28_4_ + 0.0;
              auVar28 = vpminsd_avx2(auVar31,auVar41);
              auVar26 = vpminsd_avx2(auVar30,auVar43);
              auVar29 = vpminsd_avx2(auVar38,auVar46);
              auVar26 = vmaxps_avx(auVar26,auVar29);
              auVar29 = vpmaxsd_avx2(auVar31,auVar41);
              auVar31 = vpmaxsd_avx2(auVar30,auVar43);
              auVar27 = vpmaxsd_avx2(auVar38,auVar46);
              auVar31 = vminps_avx(auVar31,auVar27);
              auVar27 = vmaxps_avx512vl(auVar91._0_32_,auVar28);
              auVar26 = vmaxps_avx(auVar27,auVar26);
              auVar29 = vminps_avx(auVar40._0_32_,auVar29);
              auVar29 = vminps_avx(auVar29,auVar31);
              auVar27._8_4_ = 0x3f7ffffa;
              auVar27._0_8_ = 0x3f7ffffa3f7ffffa;
              auVar27._12_4_ = 0x3f7ffffa;
              auVar27._16_4_ = 0x3f7ffffa;
              auVar27._20_4_ = 0x3f7ffffa;
              auVar27._24_4_ = 0x3f7ffffa;
              auVar27._28_4_ = 0x3f7ffffa;
              auVar26 = vmulps_avx512vl(auVar26,auVar27);
              auVar28._8_4_ = 0x3f800003;
              auVar28._0_8_ = 0x3f8000033f800003;
              auVar28._12_4_ = 0x3f800003;
              auVar28._16_4_ = 0x3f800003;
              auVar28._20_4_ = 0x3f800003;
              auVar28._24_4_ = 0x3f800003;
              auVar28._28_4_ = 0x3f800003;
              auVar29 = vmulps_avx512vl(auVar29,auVar28);
              goto LAB_01fb8289;
            }
            bVar3 = false;
          }
          if (bVar3) {
            if (unaff_R15 == 0) {
              iVar10 = 4;
            }
            else {
              auVar26 = *(undefined1 (*) [32])(uVar18 & 0xfffffffffffffff0);
              auVar42 = ZEXT3264(auVar26);
              auVar29 = ((undefined1 (*) [32])(uVar18 & 0xfffffffffffffff0))[1];
              auVar44 = ZEXT3264(auVar29);
              auVar31 = vmovdqa64_avx512vl(auVar92._0_32_);
              auVar28 = auVar74._0_32_;
              auVar31 = vpternlogd_avx512vl(auVar31,auVar28,auVar93._0_32_,0xf8);
              uVar18 = unaff_R15 & 0xffffffff;
              auVar27 = vpcompressd_avx512vl(auVar31);
              bVar3 = (bool)((byte)uVar18 & 1);
              auVar32._0_4_ = (uint)bVar3 * auVar27._0_4_ | (uint)!bVar3 * auVar31._0_4_;
              bVar3 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar32._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar31._4_4_;
              bVar3 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar32._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar31._8_4_;
              bVar3 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar32._12_4_ = (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar31._12_4_;
              bVar3 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar32._16_4_ = (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar31._16_4_;
              bVar3 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar32._20_4_ = (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar31._20_4_;
              bVar3 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar32._24_4_ = (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar31._24_4_;
              bVar3 = (bool)((byte)(uVar18 >> 7) & 1);
              auVar32._28_4_ = (uint)bVar3 * auVar27._28_4_ | (uint)!bVar3 * auVar31._28_4_;
              auVar31 = vpermt2q_avx512vl(auVar26,auVar32,auVar29);
              uVar18 = auVar31._0_8_;
              iVar10 = 0;
              uVar13 = unaff_R15 - 1 & unaff_R15;
              if (uVar13 != 0) {
                auVar31 = vpshufd_avx2(auVar32,0x55);
                vpermt2q_avx512vl(auVar26,auVar31,auVar29);
                auVar27 = vpminsd_avx2(auVar32,auVar31);
                auVar31 = vpmaxsd_avx2(auVar32,auVar31);
                uVar13 = uVar13 - 1 & uVar13;
                if (uVar13 == 0) {
                  auVar27 = vpermi2q_avx512vl(auVar27,auVar26,auVar29);
                  uVar18 = auVar27._0_8_;
                  auVar26 = vpermt2q_avx512vl(auVar26,auVar31,auVar29);
                  *puVar15 = auVar26._0_8_;
                  auVar26 = vpermd_avx2(auVar31,auVar28);
                  auVar42 = ZEXT3264(auVar26);
                  *(int *)(puVar15 + 1) = auVar26._0_4_;
                  puVar15 = puVar15 + 2;
                }
                else {
                  auVar36 = vpshufd_avx2(auVar32,0xaa);
                  vpermt2q_avx512vl(auVar26,auVar36,auVar29);
                  auVar30 = vpminsd_avx2(auVar27,auVar36);
                  auVar27 = vpmaxsd_avx2(auVar27,auVar36);
                  auVar36 = vpminsd_avx2(auVar31,auVar27);
                  auVar31 = vpmaxsd_avx2(auVar31,auVar27);
                  uVar13 = uVar13 - 1 & uVar13;
                  if (uVar13 == 0) {
                    auVar27 = vpermi2q_avx512vl(auVar30,auVar26,auVar29);
                    uVar18 = auVar27._0_8_;
                    auVar27 = vpermt2q_avx512vl(auVar26,auVar31,auVar29);
                    *puVar15 = auVar27._0_8_;
                    auVar31 = vpermd_avx2(auVar31,auVar28);
                    *(int *)(puVar15 + 1) = auVar31._0_4_;
                    auVar26 = vpermt2q_avx512vl(auVar26,auVar36,auVar29);
                    puVar15[2] = auVar26._0_8_;
                    auVar26 = vpermd_avx2(auVar36,auVar28);
                    auVar42 = ZEXT3264(auVar26);
                    *(int *)(puVar15 + 3) = auVar26._0_4_;
                    puVar15 = puVar15 + 4;
                  }
                  else {
                    auVar27 = vpshufd_avx2(auVar32,0xff);
                    vpermt2q_avx512vl(auVar26,auVar27,auVar29);
                    auVar38 = vpminsd_avx2(auVar30,auVar27);
                    auVar27 = vpmaxsd_avx2(auVar30,auVar27);
                    auVar30 = vpminsd_avx2(auVar36,auVar27);
                    auVar27 = vpmaxsd_avx2(auVar36,auVar27);
                    auVar36 = vpminsd_avx2(auVar31,auVar27);
                    auVar31 = vpmaxsd_avx2(auVar31,auVar27);
                    uVar13 = uVar13 - 1 & uVar13;
                    if (uVar13 == 0) {
                      auVar27 = vpermi2q_avx512vl(auVar38,auVar26,auVar29);
                      uVar18 = auVar27._0_8_;
                      auVar27 = vpermt2q_avx512vl(auVar26,auVar31,auVar29);
                      *puVar15 = auVar27._0_8_;
                      auVar74 = ZEXT3264(auVar28);
                      auVar31 = vpermd_avx2(auVar31,auVar28);
                      *(int *)(puVar15 + 1) = auVar31._0_4_;
                      auVar31 = vpermt2q_avx512vl(auVar26,auVar36,auVar29);
                      puVar15[2] = auVar31._0_8_;
                      auVar31 = vpermd_avx2(auVar36,auVar28);
                      *(int *)(puVar15 + 3) = auVar31._0_4_;
                      auVar26 = vpermt2q_avx512vl(auVar26,auVar30,auVar29);
                      puVar15[4] = auVar26._0_8_;
                      auVar26 = vpermd_avx2(auVar30,auVar28);
                      auVar42 = ZEXT3264(auVar26);
                      *(int *)(puVar15 + 5) = auVar26._0_4_;
                      puVar15 = puVar15 + 6;
                    }
                    else {
                      auVar37 = valignd_avx512vl(auVar32,auVar32,3);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar38 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar27,auVar38);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar30 = vpermt2d_avx512vl(auVar38,auVar27,auVar30);
                      auVar30 = vpermt2d_avx512vl(auVar30,auVar27,auVar36);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar31 = vpermt2d_avx512vl(auVar30,auVar27,auVar31);
                      auVar74 = ZEXT3264(auVar31);
                      uVar18 = uVar13;
                      do {
                        auVar27 = auVar74._0_32_;
                        auVar47._8_4_ = 1;
                        auVar47._0_8_ = 0x100000001;
                        auVar47._12_4_ = 1;
                        auVar47._16_4_ = 1;
                        auVar47._20_4_ = 1;
                        auVar47._24_4_ = 1;
                        auVar47._28_4_ = 1;
                        auVar31 = vpermd_avx2(auVar47,auVar37);
                        auVar37 = valignd_avx512vl(auVar37,auVar37,1);
                        vpermt2q_avx512vl(auVar26,auVar37,auVar29);
                        uVar18 = uVar18 - 1 & uVar18;
                        uVar4 = vpcmpd_avx512vl(auVar31,auVar27,5);
                        auVar31 = vpmaxsd_avx2(auVar31,auVar27);
                        bVar5 = (byte)uVar4 << 1;
                        auVar27 = valignd_avx512vl(auVar27,auVar27,7);
                        bVar3 = (bool)((byte)uVar4 & 1);
                        auVar39._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar31._4_4_;
                        auVar39._0_4_ = auVar31._0_4_;
                        bVar3 = (bool)(bVar5 >> 2 & 1);
                        auVar39._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar31._8_4_;
                        bVar3 = (bool)(bVar5 >> 3 & 1);
                        auVar39._12_4_ =
                             (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar31._12_4_;
                        bVar3 = (bool)(bVar5 >> 4 & 1);
                        auVar39._16_4_ =
                             (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar31._16_4_;
                        bVar3 = (bool)(bVar5 >> 5 & 1);
                        auVar39._20_4_ =
                             (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar31._20_4_;
                        bVar3 = (bool)(bVar5 >> 6 & 1);
                        auVar39._24_4_ =
                             (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar31._24_4_;
                        auVar39._28_4_ =
                             (uint)(bVar5 >> 7) * auVar27._28_4_ |
                             (uint)!(bool)(bVar5 >> 7) * auVar31._28_4_;
                        auVar74 = ZEXT3264(auVar39);
                      } while (uVar18 != 0);
                      lVar12 = POPCOUNT(uVar13) + 3;
                      do {
                        auVar31 = vpermi2q_avx512vl(auVar39,auVar26,auVar29);
                        *puVar15 = auVar31._0_8_;
                        auVar27 = auVar74._0_32_;
                        auVar31 = vpermd_avx2(auVar27,auVar28);
                        *(int *)(puVar15 + 1) = auVar31._0_4_;
                        auVar39 = valignd_avx512vl(auVar27,auVar27,1);
                        puVar15 = puVar15 + 2;
                        auVar74 = ZEXT3264(auVar39);
                        lVar12 = lVar12 + -1;
                      } while (lVar12 != 0);
                      auVar26 = vpermt2q_avx512vl(auVar26,auVar39,auVar29);
                      auVar42 = ZEXT3264(auVar26);
                      uVar18 = auVar26._0_8_;
                      auVar74 = ZEXT3264(auVar28);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar10 = 6;
          }
        } while (iVar10 == 0);
        if (iVar10 == 6) {
          local_2398 = auVar74._0_32_;
          (**(code **)((long)This->leafIntersector +
                      (ulong)*(byte *)(uVar18 & 0xfffffffffffffff0) * 0x40))(local_2578,ray,context)
          ;
          auVar74 = ZEXT3264(local_2398);
          auVar26 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
          auVar93 = ZEXT3264(auVar26);
          auVar26 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
          auVar92 = ZEXT3264(auVar26);
          auVar91 = ZEXT3264(local_24d8);
          auVar90 = ZEXT3264(local_24b8);
          auVar89 = ZEXT3264(local_2498);
          auVar88 = ZEXT3264(local_2478);
          auVar87 = ZEXT3264(local_2458);
          auVar86 = ZEXT3264(local_2438);
          auVar85 = ZEXT3264(local_2418);
          auVar84 = ZEXT3264(local_23f8);
          auVar83 = ZEXT3264(local_23d8);
          auVar82 = ZEXT3264(local_23b8);
          fVar48 = (ray->super_RayK<1>).tfar;
          auVar40 = ZEXT3264(CONCAT428(fVar48,CONCAT424(fVar48,CONCAT420(fVar48,CONCAT416(fVar48,
                                                  CONCAT412(fVar48,CONCAT48(fVar48,CONCAT44(fVar48,
                                                  fVar48))))))));
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }